

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void VR4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int D;
  int C;
  int B;
  int A;
  int K;
  int J;
  int I;
  int X;
  uint8_t *top_local;
  uint8_t *dst_local;
  
  uVar5 = (uint)top[-1];
  uVar6 = (uint)top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  uVar7 = (uint)*top;
  uVar8 = (uint)top[1];
  uVar9 = (uint)top[2];
  bVar3 = top[3];
  uVar4 = (uint8_t)((int)(uVar5 + uVar7 + 1) >> 1);
  dst[0x41] = uVar4;
  *dst = uVar4;
  uVar4 = (uint8_t)((int)(uVar7 + uVar8 + 1) >> 1);
  dst[0x42] = uVar4;
  dst[1] = uVar4;
  uVar4 = (uint8_t)((int)(uVar8 + uVar9 + 1) >> 1);
  dst[0x43] = uVar4;
  dst[2] = uVar4;
  dst[3] = (uint8_t)((int)(uVar9 + bVar3 + 1) >> 1);
  dst[0x60] = (uint8_t)((int)((uint)bVar2 + (uint)bVar1 * 2 + uVar6 + 2) >> 2);
  dst[0x40] = (uint8_t)((int)((uint)bVar1 + uVar6 * 2 + uVar5 + 2) >> 2);
  uVar4 = (uint8_t)((int)(uVar6 + uVar5 * 2 + uVar7 + 2) >> 2);
  dst[0x61] = uVar4;
  dst[0x20] = uVar4;
  uVar4 = (uint8_t)((int)(uVar5 + uVar7 * 2 + uVar8 + 2) >> 2);
  dst[0x62] = uVar4;
  dst[0x21] = uVar4;
  uVar4 = (uint8_t)((int)(uVar7 + uVar8 * 2 + uVar9 + 2) >> 2);
  dst[99] = uVar4;
  dst[0x22] = uVar4;
  dst[0x23] = (uint8_t)((int)(uVar8 + uVar9 * 2 + (uint)bVar3 + 2) >> 2);
  return;
}

Assistant:

static void VR4(uint8_t* dst, const uint8_t* top) {
  const int X = top[-1];
  const int I = top[-2];
  const int J = top[-3];
  const int K = top[-4];
  const int A = top[0];
  const int B = top[1];
  const int C = top[2];
  const int D = top[3];
  DST(0, 0) = DST(1, 2) = AVG2(X, A);
  DST(1, 0) = DST(2, 2) = AVG2(A, B);
  DST(2, 0) = DST(3, 2) = AVG2(B, C);
  DST(3, 0)             = AVG2(C, D);

  DST(0, 3) =             AVG3(K, J, I);
  DST(0, 2) =             AVG3(J, I, X);
  DST(0, 1) = DST(1, 3) = AVG3(I, X, A);
  DST(1, 1) = DST(2, 3) = AVG3(X, A, B);
  DST(2, 1) = DST(3, 3) = AVG3(A, B, C);
  DST(3, 1) =             AVG3(B, C, D);
}